

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O2

b_str<char32_t> *
detail::operator|(b_str<char32_t> *__return_storage_ptr__,b_str<char32_t> *str,
                 split_helper_subroutine<detail::split_at_first_back,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_char32_t>
                 *info)

{
  _If_sv<std::basic_string_view<char32_t>,_size_type> _Var1;
  
  _Var1 = std::__cxx11::u32string::
          find_first_of<std::basic_string_view<char32_t,std::char_traits<char32_t>>>
                    ((u32string *)str,&info->delim,0);
  if (_Var1 == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  }
  else {
    _Var1 = std::__cxx11::u32string::
            find_first_not_of<std::basic_string_view<char32_t,std::char_traits<char32_t>>>
                      ((u32string *)str,&info->delim,_Var1);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    erase(str,0,_Var1);
    std::__cxx11::u32string::u32string(__return_storage_ptr__,str);
  }
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first_back, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return {};
		str.erase(0, str.find_first_not_of(info.delim, pos));
		return std::move(str);
	}